

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_acct_resp(Curl_easy *data,int ftpcode)

{
  anon_union_248_5_a113b5f6_for_proto *pp;
  CURLcode CVar1;
  ftpstate fVar2;
  
  if (ftpcode != 0xe6) {
    Curl_failf(data,"ACCT rejected by server: %03d",(ulong)(uint)ftpcode);
    return CURLE_FTP_WEIRD_PASS_REPLY;
  }
  pp = &data->conn->proto;
  if (((data->conn->bits).field_0x6 & 0x20) == 0) {
    CVar1 = Curl_pp_sendf(data,&(pp->ftpc).pp,"%s","PWD");
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    fVar2 = FTP_PWD;
  }
  else {
    CVar1 = Curl_pp_sendf(data,&(pp->ftpc).pp,"PBSZ %d",0);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    fVar2 = FTP_PBSZ;
  }
  (data->conn->proto).ftpc.state = fVar2;
  return CURLE_OK;
}

Assistant:

static CURLcode ftp_state_acct_resp(struct Curl_easy *data,
                                    int ftpcode)
{
  CURLcode result = CURLE_OK;
  if(ftpcode != 230) {
    failf(data, "ACCT rejected by server: %03d", ftpcode);
    result = CURLE_FTP_WEIRD_PASS_REPLY; /* FIX */
  }
  else
    result = ftp_state_loggedin(data);

  return result;
}